

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O0

uint8_t * toHexString_abi_cxx11_(uint8_t *pData,size_t size)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  ulong in_RDX;
  ulong local_1b0;
  size_t i;
  stringstream ss;
  ostream local_198 [376];
  ulong local_20;
  size_t size_local;
  uint8_t *pData_local;
  
  local_20 = in_RDX;
  size_local = size;
  pData_local = pData;
  std::__cxx11::stringstream::stringstream((stringstream *)&i);
  for (local_1b0 = 0; local_1b0 < local_20; local_1b0 = local_1b0 + 1) {
    poVar3 = (ostream *)std::ostream::operator<<(local_198,std::hex);
    _Var2 = std::setw(2);
    poVar3 = std::operator<<(poVar3,_Var2);
    _Var1 = std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,_Var1._M_c);
    std::ostream::operator<<(poVar3,(uint)*(byte *)(size_local + local_1b0));
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&i);
  return pData;
}

Assistant:

inline std::string toHexString(const uint8_t* pData, size_t size)
{
    std::stringstream ss;;
    for (size_t i=0; i<size; i++)
    {
        ss << std::hex << std::setw(2) << std::setfill('0') << unsigned(pData[i]);
    }

    return ss.str();
}